

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionsMap.h
# Opt level: O0

bool __thiscall
dg::dda::DefinitionsMap<dg::dda::RWNode>::
add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
          (DefinitionsMap<dg::dda::RWNode> *this,DefSite *ds,
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
          *nodes)

{
  bool bVar1;
  reference ppRVar2;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *in_RDI;
  RWNode *unaff_retaddr;
  RWNode *n;
  iterator __end0;
  iterator __begin0;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *__range3
  ;
  bool changed;
  RWNode *this_00;
  _Self local_38;
  _Self local_30 [2];
  byte local_19;
  
  local_19 = 0;
  local_30[0]._M_node =
       (_Base_ptr)
       std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
       ::begin(in_RDI);
  local_38._M_node =
       (_Base_ptr)
       std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
       ::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=(local_30,&local_38);
    if (!bVar1) break;
    ppRVar2 = std::_Rb_tree_const_iterator<dg::dda::RWNode_*>::operator*
                        ((_Rb_tree_const_iterator<dg::dda::RWNode_*> *)0x183648);
    this_00 = *ppRVar2;
    bVar1 = add((DefinitionsMap<dg::dda::RWNode> *)__end0._M_node,(DefSite *)n,unaff_retaddr);
    local_19 = (local_19 & 1) != 0 || bVar1;
    std::_Rb_tree_const_iterator<dg::dda::RWNode_*>::operator++
              ((_Rb_tree_const_iterator<dg::dda::RWNode_*> *)this_00);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool add(const DefSite &ds, const ContainerT &nodes) {
        bool changed = false;
        for (auto *n : nodes)
            changed |= add(ds, n);
        return changed;
    }